

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

void __thiscall toml::type_error::~type_error(type_error *this)

{
  ~type_error(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

~type_error() noexcept override = default;